

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O2

void sylvan_init_package(void)

{
  Task local_40;
  
  if (table_max != 0) {
    nodes = llmsset_create(table_min,table_max);
    cache_create(cache_min,cache_max);
    LOCK();
    gc = 0;
    UNLOCK();
    main_hook = sylvan_gc_aggressive_resize_CALL;
    local_40.f = sylvan_stats_init_WRAP;
    local_40.thief = (_Worker *)0x1;
    lace_run_task(&local_40);
    return;
  }
  fwrite("sylvan_init_package error: table sizes not set (sylvan_set_sizes or sylvan_set_limits)!",
         0x57,1,_stderr);
  exit(1);
}

Assistant:

void
sylvan_init_package(void)
{
    if (table_max == 0) {
        fprintf(stderr, "sylvan_init_package error: table sizes not set (sylvan_set_sizes or sylvan_set_limits)!");
        exit(1);
    }

    /* Create tables */
    nodes = llmsset_create(table_min, table_max);
    cache_create(cache_min, cache_max);

    /* Initialize garbage collection */
    gc = 0;
#if SYLVAN_AGGRESSIVE_RESIZE
    main_hook = TASK(sylvan_gc_aggressive_resize);
#else
    main_hook = TASK(sylvan_gc_normal_resize);
#endif

    sylvan_stats_init();
}